

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_initCStream_usingDict
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,int compressionLevel)

{
  uint uVar1;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  ZSTD_CCtx *in_stack_ffffffffffffffb8;
  ZSTD_CCtx *in_stack_ffffffffffffffc0;
  ZSTD_CCtx *in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  local_8 = ZSTD_CCtx_reset(in_stack_ffffffffffffffb8,0);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = ZSTD_CCtx_setParameter
                        (in_stack_ffffffffffffffc8,
                         (ZSTD_cParameter)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                         (int)in_stack_ffffffffffffffc0);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      local_8 = ZSTD_CCtx_loadDictionary
                          (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x27e81ac);
      uVar1 = ERR_isError(local_8);
      if (uVar1 == 0) {
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_initCStream_usingDict(ZSTD_CStream* zcs, const void* dict, size_t dictSize, int compressionLevel)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingDict");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    return 0;
}